

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_bind.c
# Opt level: O2

int mpt_library_bind(mpt_libsymbol *sym,char *conf,char *path,mpt_logger *out)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  undefined1 uVar5;
  undefined7 uVar6;
  int iVar7;
  char *pcVar8;
  mpt_libsymbol next;
  
  uVar5 = SUB81(out,0);
  uVar6 = (undefined7)((ulong)out >> 8);
  next.lib = (mpt_libhandle *)0x0;
  next.addr = (void *)0x0;
  next.type = 0;
  if (conf == (char *)0x0) {
    iVar7 = -1;
    if (out == (mpt_logger *)0x0) {
      return -1;
    }
    pcVar3 = "missing initializer target";
    pcVar8 = (char *)0x0;
LAB_00101328:
    msg(out,pcVar8,3,(char *)CONCAT71(uVar6,uVar5),pcVar3);
  }
  else {
    pcVar3 = strchr(conf,0x40);
    iVar7 = -2;
    if (pcVar3 == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      pcVar8 = path;
      next.lib = mpt_library_open(pcVar3 + 1,path);
      if (next.lib == (mpt_libhandle *)0x0) {
        if ((out != (mpt_logger *)0x0) && (lVar4 = dlerror(), lVar4 != 0)) {
          msg(out,pcVar8,(path == (char *)0x0) + 3,(char *)CONCAT71(uVar6,uVar5),lVar4);
        }
        if (path == (char *)0x0) {
          return -2;
        }
        pcVar8 = (char *)0x0;
        next.lib = mpt_library_open(pcVar3 + 1,(char *)0x0);
        uVar5 = next.lib != (mpt_libhandle *)0x0 || out == (mpt_logger *)0x0;
        if (next.lib == (mpt_libhandle *)0x0 && out != (mpt_logger *)0x0) {
          pcVar3 = (char *)dlerror();
          if (pcVar3 == (char *)0x0) {
            return -2;
          }
          goto LAB_00101328;
        }
        if (next.lib == (mpt_libhandle *)0x0) {
          return -2;
        }
        iVar2 = 2;
      }
      else {
        iVar2 = 1;
      }
    }
    iVar1 = mpt_library_symbol(&next,conf);
    if (iVar1 < 0) {
      if ((out != (mpt_logger *)0x0) && (lVar4 = dlerror(), lVar4 != 0)) {
        msg(out,conf,3,(char *)CONCAT71(uVar6,uVar5),lVar4);
      }
      iVar2 = mpt_library_detach(&next.lib);
      if (iVar2 < 0) {
        if (out == (mpt_logger *)0x0) {
          abort();
        }
        lVar4 = dlerror();
        iVar7 = iVar2;
        if (lVar4 != 0) {
          msg(out,conf,1,(char *)CONCAT71(uVar6,uVar5),lVar4);
        }
      }
    }
    else {
      mpt_library_detach(&sym->lib);
      sym->lib = next.lib;
      sym->addr = next.addr;
      sym->type = next.type;
      iVar7 = iVar2;
    }
  }
  return iVar7;
}

Assistant:

extern int mpt_library_bind(MPT_STRUCT(libsymbol) *sym, const char *conf, const char *path, MPT_INTERFACE(logger) *out)
{
	MPT_STRUCT(libsymbol) next = MPT_LIBSYMBOL_INIT;
	const char *libname;
	int ret = 0;
	
	if (!conf) {
		if (out) {
			msg(out, __func__, MPT_LOG(Error), "%s", MPT_tr("missing initializer target"));
		}
		return MPT_ERROR(BadArgument);
	}
	if ((libname = strchr(conf, '@'))) {
		ret = 1;
		++libname;
		/* load from special or default location */
		if (!(next.lib = mpt_library_open(libname, path))) {
			const char *err;
			if (out && (err = dlerror())) {
				ret = path ? MPT_LOG(Error) : MPT_LOG(Warning);
				msg(out, __func__, ret, "%s", err);
			}
			if (!path) {
				return MPT_ERROR(BadValue);
			}
			/* fallback to default library locations */
			if (!(next.lib = mpt_library_open(libname, 0))) {
				if (out && (err = dlerror())) {
					msg(out, __func__, MPT_LOG(Error), "%s", err);
				}
				return MPT_ERROR(BadValue);
			}
			ret = 2;
		}
	}
	if (mpt_library_symbol(&next, conf) < 0) {
		const char *err;
		if (out && (err = dlerror())) {
			msg(out, __func__, MPT_LOG(Error), "%s", err);
		}
		if ((ret = mpt_library_detach(&next.lib)) < 0) {
			if (!out) {
				abort();
			}
			if ((err = dlerror())) {
				msg(out, __func__, MPT_LOG(Fatal), "%s", err);
			}
			return ret;
		}
		return MPT_ERROR(BadValue);
	}
	mpt_library_detach(&sym->lib);
	
	*sym = next;
	
	return ret;
}